

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

Assignment * __thiscall
soul::PoolAllocator::
allocate<soul::AST::Assignment,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::AST::TypeCast&>
          (PoolAllocator *this,Context *args,pool_ref<soul::AST::Expression> *args_1,
          TypeCast *args_2)

{
  pool_ref<soul::AST::Expression> *c;
  Context *this_00;
  Expression *dest;
  DestructorFn *pDVar1;
  _lambda_void___1_ local_39;
  Assignment *local_38;
  Assignment *newObject;
  PoolItem *newItem;
  TypeCast *args_local_2;
  pool_ref<soul::AST::Expression> *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_2;
  args_local_2 = (TypeCast *)args_1;
  args_local_1 = (pool_ref<soul::AST::Expression> *)args;
  args_local = (Context *)this;
  newObject = (Assignment *)allocateSpaceForObject(this,0x40);
  c = args_local_1;
  this_00 = &(newObject->super_Expression).super_Statement.super_ASTObject.context;
  dest = pool_ref::operator_cast_to_Expression_((pool_ref *)args_local_2);
  AST::Assignment::Assignment((Assignment *)this_00,(Context *)c,dest,(Expression *)newItem);
  local_38 = (Assignment *)this_00;
  pDVar1 = allocate(soul::AST::Context&,soul::pool_ref&,soul::AST::TypeCast&)::{lambda(void*)#1}::
           operator_cast_to_function_pointer(&local_39);
  *(DestructorFn **)&(newObject->super_Expression).super_Statement.super_ASTObject.objectType =
       pDVar1;
  return local_38;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }